

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O2

wchar_t pick_one_chest_trap(wchar_t level)

{
  chest_trap *pcVar1;
  uint32_t uVar2;
  bool bVar3;
  
  uVar2 = 0;
  pcVar1 = chest_traps;
  while (pcVar1 = pcVar1->next, pcVar1 != (chest_trap *)0x0) {
    uVar2 = uVar2 + (pcVar1->level <= level);
  }
  uVar2 = Rand_div(uVar2);
  pcVar1 = chest_traps;
  do {
    pcVar1 = pcVar1->next;
    bVar3 = uVar2 != 0;
    uVar2 = uVar2 - 1;
    if (pcVar1 == (chest_trap *)0x0) break;
  } while (bVar3);
  return pcVar1->pval;
}

Assistant:

static int pick_one_chest_trap(int level)
{
	int count = 0, pick;
	struct chest_trap *trap;

	/* Count possible traps (starting after the "locked" trap) */
	for (trap = chest_traps->next; trap; trap = trap->next) {
		if (trap->level <= level) count++;
	}

	/* Pick a trap, return the pval */
	pick = randint0(count);
	for (trap = chest_traps->next; trap; trap = trap->next) {
		if (!pick--) break;
	}
	return trap->pval;
}